

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *app_description,string *app_name)

{
  string *in_RDX;
  string *in_RSI;
  App *in_stack_000000d8;
  string *in_stack_000000e0;
  string *in_stack_000000e8;
  App *in_stack_000000f0;
  string local_58 [32];
  string local_38 [56];
  
  ::std::__cxx11::string::string(local_38,in_RSI);
  ::std::__cxx11::string::string(local_58,in_RDX);
  App(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

explicit App(std::string app_description = "", std::string app_name = "")
        : App(app_description, app_name, nullptr) {
        // set_help_flag("-h,--help", "Print help.");
    }